

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O1

vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
* __thiscall
adios2::core::engine::DataManReader::DoBlocksInfo
          (vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
           *__return_storage_ptr__,DataManReader *this,Variable<double> *variable,size_t step)

{
  BlocksInfoCommon<double>(__return_storage_ptr__,this,variable,step);
  return __return_storage_ptr__;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}